

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall
server_context::send_rerank(server_context *this,server_slot *slot,llama_batch *batch)

{
  common_log *pcVar1;
  size_t __n;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  int __flags;
  char *in_R8;
  int i;
  ulong uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  long *local_40;
  long *local_38;
  
  httplib::detail::std::make_unique<server_task_result_rerank>();
  *(int *)(local_40 + 1) = slot->id_task;
  *(int *)(local_40 + 2) = (int)slot->index;
  *(int32_t *)(local_40 + 3) = slot->n_prompt_tokens;
  uVar2 = 0;
  __buf = extraout_RDX;
  while( true ) {
    __flags = (int)in_R8;
    __n = (size_t)batch->n_tokens;
    if ((long)__n <= (long)uVar2) break;
    if ((batch->logits[uVar2] != '\0') && (*batch->seq_id[uVar2] == slot->id)) {
      auVar4 = llama_get_embeddings_seq(this->ctx);
      if ((auVar4._0_8_ == 0) &&
         (auVar4 = llama_get_embeddings_ith(this->ctx,uVar2 & 0xffffffff), __buf = auVar4._8_8_,
         auVar4._0_8_ == 0)) {
        uVar3 = 0xc9742400;
        if (-1 < common_log_verbosity_thold) {
          pcVar1 = common_log_main();
          in_R8 = "send_rerank";
          common_log_add(pcVar1,GGML_LOG_LEVEL_ERROR,
                         "slot %12.*s: id %2d | task %d | failed to get embeddings, token = %d, seq_id = %d\n"
                         ,0xc,"send_rerank",(ulong)(uint)slot->id,(ulong)(uint)slot->id_task,
                         (ulong)(uint)batch->token[uVar2],(ulong)(uint)*batch->seq_id[uVar2]);
          uVar3 = 0xc9742400;
          __buf = extraout_RDX_00;
        }
      }
      else {
        __buf = auVar4._8_8_;
        uVar3 = *auVar4._0_8_;
      }
      *(undefined4 *)((long)local_40 + 0x14) = uVar3;
    }
    uVar2 = uVar2 + 1;
  }
  if (0 < common_log_verbosity_thold) {
    pcVar1 = common_log_main();
    __flags = 0x218a4a;
    common_log_add(pcVar1,GGML_LOG_LEVEL_DEBUG,
                   "slot %12.*s: id %2d | task %d | sending rerank result, res.score = %f\n",
                   (double)*(float *)((long)local_40 + 0x14),0xc,"send_rerank",(ulong)(uint)slot->id
                   ,(ulong)(uint)slot->id_task);
    __n = 0x18b00a;
    __buf = extraout_RDX_01;
  }
  local_38 = local_40;
  server_response::send(&this->queue_results,(int)&local_38,__buf,__n,__flags);
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 0x28))();
  }
  return;
}

Assistant:

void send_rerank(const server_slot & slot, const llama_batch & batch) {
        auto res = std::make_unique<server_task_result_rerank>();
        res->id    = slot.id_task;
        res->index = slot.index;
        res->n_tokens = slot.n_prompt_tokens;

        for (int i = 0; i < batch.n_tokens; ++i) {
            if (!batch.logits[i] || batch.seq_id[i][0] != slot.id) {
                continue;
            }

            const float * embd = llama_get_embeddings_seq(ctx, batch.seq_id[i][0]);
            if (embd == NULL) {
                embd = llama_get_embeddings_ith(ctx, i);
            }

            if (embd == NULL) {
                SLT_ERR(slot, "failed to get embeddings, token = %d, seq_id = %d\n", batch.token[i], batch.seq_id[i][0]);

                res->score = -1e6;
                continue;
            }

            res->score = embd[0];
        }

        SLT_DBG(slot, "sending rerank result, res.score = %f\n", res->score);

        queue_results.send(std::move(res));
    }